

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Comment_PDU::operator==(Comment_PDU *this,Comment_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Comment_PDU *Value_local;
  Comment_PDU *this_local;
  
  KVar1 = Simulation_Management_Header::operator!=
                    (&this->super_Simulation_Management_Header,
                     &Value->super_Simulation_Management_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (this->m_ui32NumFixedDatum == Value->m_ui32NumFixedDatum) {
    if (this->m_ui32NumVariableDatum == Value->m_ui32NumVariableDatum) {
      bVar2 = std::operator!=(&this->m_vFixedDatum,&Value->m_vFixedDatum);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = std::operator!=(&this->m_vVariableDatum,&Value->m_vVariableDatum);
        if (bVar2) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Comment_PDU::operator == ( const Comment_PDU & Value ) const
{
    if( Simulation_Management_Header::operator  !=( Value ) )                     return false;
    if( m_ui32NumFixedDatum                     != Value.m_ui32NumFixedDatum )    return false;
    if( m_ui32NumVariableDatum                  != Value.m_ui32NumVariableDatum ) return false;
    if( m_vFixedDatum                           != Value.m_vFixedDatum )          return false;
    if( m_vVariableDatum                        != Value.m_vVariableDatum )       return false;
    return true;
}